

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AddGhostJoin(Clipper *this,OutPt *op,IntPoint OffPt)

{
  pointer *pppJVar1;
  iterator __position;
  Join *j;
  Join *local_28;
  
  local_28 = (Join *)operator_new(0x20);
  (local_28->OffPt).X = 0;
  (local_28->OffPt).Y = 0;
  local_28->OutPt1 = op;
  local_28->OutPt2 = (OutPt *)0x0;
  (local_28->OffPt).X = OffPt.X;
  (local_28->OffPt).Y = OffPt.Y;
  __position._M_current =
       (this->m_GhostJoins).
       super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_GhostJoins).
      super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::Join*,std::allocator<ClipperLib::Join*>>::
    _M_realloc_insert<ClipperLib::Join*const&>
              ((vector<ClipperLib::Join*,std::allocator<ClipperLib::Join*>> *)&this->m_GhostJoins,
               __position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppJVar1 = &(this->m_GhostJoins).
                super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppJVar1 = *pppJVar1 + 1;
  }
  return;
}

Assistant:

void Clipper::AddGhostJoin(OutPt *op, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op;
  j->OutPt2 = 0;
  j->OffPt = OffPt;
  m_GhostJoins.push_back(j);
}